

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O0

void __thiscall wallet::SQLiteDatabase::~SQLiteDatabase(SQLiteDatabase *this)

{
  long lVar1;
  CSemaphore *in_RDI;
  long in_FS_OFFSET;
  SQLiteDatabase *in_stack_00000030;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)in_RDI = &PTR__SQLiteDatabase_01616668;
  Cleanup(in_stack_00000030);
  CSemaphore::~CSemaphore(in_RDI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  WalletDatabase::~WalletDatabase((WalletDatabase *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLiteDatabase::~SQLiteDatabase()
{
    Cleanup();
}